

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  TestingPortal *pTVar3;
  undefined4 *puVar4;
  char *pcVar5;
  UnitTest *this;
  undefined1 local_48 [8];
  Cleanup<std::function<void_()>_> fork_cleanup;
  char **argv_local;
  int argc_local;
  
  fork_cleanup.callback_._M_invoker = (_Invoker_type)argv;
  argv_local._4_4_ = argc;
  HandleVariableRuns(argc,argv);
  pTVar3 = tcmalloc::TestingPortal::Get();
  cVar1 = (**(code **)(*(long *)pTVar3 + 8))(pTVar3);
  if (cVar1 != '\0') {
    pTVar3 = tcmalloc::TestingPortal::Get();
    puVar4 = (undefined4 *)(**(code **)(*(long *)pTVar3 + 0x38))(pTVar3);
    *puVar4 = 0;
  }
  pcVar5 = getenv("DONT_TEST_SYSTEM_RELEASE");
  if (pcVar5 == (char *)0x0) {
    pTVar3 = tcmalloc::TestingPortal::Get();
    cVar1 = (*(code *)**(undefined8 **)pTVar3)(pTVar3);
    if (cVar1 == '\0') {
      syscall(1,2,"Check failed: TestingPortal::Get()->HaveSystemRelease()\n",0x38);
      abort();
    }
  }
  testing::InitGoogleTest((int *)((long)&argv_local + 4),argv);
  fork_torture::setup_fork_testing
            ((Cleanup<std::function<void_()>_> *)local_48,(int *)((long)&argv_local + 4),
             (char ***)&fork_cleanup.callback_._M_invoker);
  this = testing::UnitTest::GetInstance();
  iVar2 = testing::UnitTest::Run(this);
  tcmalloc::Cleanup<std::function<void_()>_>::~Cleanup((Cleanup<std::function<void_()>_> *)local_48)
  ;
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {
  HandleVariableRuns(argc, argv);

  if (TestingPortal::Get()->IsDebuggingMalloc()) {
    // return freed blocks to tcmalloc immediately
    TestingPortal::Get()->GetMaxFreeQueueSize() = 0;
  }

#if defined(__linux) || defined(_WIN32)
  // We know that Linux and Windows have functional memory releasing
  // support. So don't let us degrade on that.
  if (!getenv("DONT_TEST_SYSTEM_RELEASE")) {
    CHECK(TestingPortal::Get()->HaveSystemRelease());
  }
#endif

  testing::InitGoogleTest(&argc, argv);

  auto fork_cleanup = setup_fork_testing(&argc, &argv);
  (void)fork_cleanup;

  int err_code = RUN_ALL_TESTS();
  if (err_code) {
    return err_code;
  }
}